

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall yy::parser::error(parser *this,syntax_error *yyexc)

{
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  
  __s = (char *)(**(code **)(*(long *)yyexc + 0x10))(yyexc);
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  (*this->_vptr_parser[3])(this,&yyexc->location,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
  parser::error (const syntax_error& yyexc)
  {
    error (yyexc.location, yyexc.what ());
  }